

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O3

int KINSetSysFunc(void *kinmem,KINSysFn func)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    iVar1 = -1;
    error_code = -1;
  }
  else {
    if (func != (KINSysFn)0x0) {
      *(KINSysFn *)((long)kinmem + 8) = func;
      return 0;
    }
    msgfmt = "func = NULL illegal.";
    iVar1 = -2;
    error_code = -2;
  }
  KINProcessError((KINMem)0x0,error_code,"KINSOL","KINSetSysFunc",msgfmt);
  return iVar1;
}

Assistant:

int KINSetSysFunc(void *kinmem, KINSysFn func)
{
  KINMem kin_mem;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINSetSysFunc", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;

  if (func == NULL) {
    KINProcessError(NULL, KIN_ILL_INPUT, "KINSOL", "KINSetSysFunc", MSG_FUNC_NULL);
    return(KIN_ILL_INPUT);
  }

  kin_mem->kin_func = func;

  return(KIN_SUCCESS);
}